

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYs<float>,ImPlot::GetterXsYRef<float>,ImPlot::TransformerLinLin>
               (GetterXsYs<float> *getter1,GetterXsYRef<float> *getter2,
               TransformerLinLin *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  ImPlotPlot *pIVar5;
  float fVar6;
  ImPlotContext *pIVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_78;
  float local_6c;
  ImDrawList *local_68;
  TransformerLinLin *local_60;
  LineSegmentsRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLinLin>
  local_58;
  
  pIVar7 = GImPlot;
  local_68 = DrawList;
  local_60 = transformer;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_58.Prims = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_58.Prims = getter1->Count;
    }
    local_58.Getter1 = getter1;
    local_58.Getter2 = getter2;
    local_58.Transformer = transformer;
    local_58.Col = col;
    local_58.Weight = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYs<float>,ImPlot::GetterXsYRef<float>,ImPlot::TransformerLinLin>>
              (&local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar9 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar9 = getter1->Count;
    }
    if (0 < iVar9) {
      iVar10 = 0;
      local_6c = line_weight;
      do {
        iVar3 = getter1->Count;
        lVar8 = (long)(((getter1->Offset + iVar10) % iVar3 + iVar3) % iVar3) * (long)getter1->Stride
        ;
        iVar3 = local_60->YAxis;
        pIVar5 = GImPlot->CurrentPlot;
        dVar2 = (pIVar5->XAxis).Range.Min;
        fVar12 = (float)(((double)*(float *)((long)getter1->Xs + lVar8) - dVar2) * GImPlot->Mx +
                        (double)GImPlot->PixelRange[iVar3].Min.x);
        fVar13 = (float)(((double)*(float *)((long)getter1->Ys + lVar8) -
                         pIVar5->YAxis[iVar3].Range.Min) * GImPlot->My[iVar3] +
                        (double)GImPlot->PixelRange[iVar3].Min.y);
        local_58.Getter1 = (GetterXsYs<float> *)CONCAT44(fVar13,fVar12);
        iVar4 = getter2->Count;
        local_78.x = (float)(((double)*(float *)((long)getter2->Xs +
                                                (long)(((getter2->Offset + iVar10) % iVar4 + iVar4)
                                                      % iVar4) * (long)getter2->Stride) - dVar2) *
                             GImPlot->Mx + (double)GImPlot->PixelRange[iVar3].Min.x);
        fVar11 = (float)((getter2->YRef - pIVar5->YAxis[iVar3].Range.Min) * GImPlot->My[iVar3] +
                        (double)GImPlot->PixelRange[iVar3].Min.y);
        local_78.y = fVar11;
        pIVar5 = pIVar7->CurrentPlot;
        fVar6 = fVar13;
        if (fVar11 <= fVar13) {
          fVar6 = fVar11;
        }
        if ((fVar6 < (pIVar5->PlotRect).Max.y) &&
           (fVar6 = (float)(~-(uint)(fVar11 <= fVar13) & (uint)fVar11 |
                           (uint)fVar13 & -(uint)(fVar11 <= fVar13)),
           pfVar1 = &(pIVar5->PlotRect).Min.y, *pfVar1 <= fVar6 && fVar6 != *pfVar1)) {
          fVar6 = fVar12;
          if (local_78.x <= fVar12) {
            fVar6 = local_78.x;
          }
          if ((fVar6 < (pIVar5->PlotRect).Max.x) &&
             (fVar6 = (float)(~-(uint)(local_78.x <= fVar12) & (uint)local_78.x |
                             (uint)fVar12 & -(uint)(local_78.x <= fVar12)),
             (pIVar5->PlotRect).Min.x <= fVar6 && fVar6 != (pIVar5->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_68,(ImVec2 *)&local_58,&local_78,col,line_weight);
            line_weight = local_6c;
          }
        }
        iVar10 = iVar10 + 1;
      } while (iVar9 != iVar10);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}